

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

Status __thiscall wallet::SQLiteCursor::Next(SQLiteCursor *this,DataStream *key,DataStream *value)

{
  pointer pbVar1;
  sqlite3_stmt *psVar2;
  int iVar3;
  long lVar4;
  Status SVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = sqlite3_step(this->m_cursor_stmt);
  if (iVar3 == 100) {
    pbVar1 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar1) {
      (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar1;
    }
    key->m_read_pos = 0;
    pbVar1 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar1) {
      (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar1;
    }
    value->m_read_pos = 0;
    psVar2 = this->m_cursor_stmt;
    lVar4 = sqlite3_column_blob(psVar2,0);
    iVar3 = sqlite3_column_bytes(psVar2,0);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)key,
               (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,lVar4,iVar3 + lVar4);
    psVar2 = this->m_cursor_stmt;
    SVar5 = MORE;
    lVar4 = sqlite3_column_blob(psVar2,1);
    iVar3 = sqlite3_column_bytes(psVar2,1);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)value,
               (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,lVar4,iVar3 + lVar4);
  }
  else {
    SVar5 = DONE;
    if (iVar3 != 0x65) {
      local_40 = (char *)sqlite3_errstr(iVar3);
      logging_function._M_str = "Next";
      logging_function._M_len = 4;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file._M_len = 0x61;
      LogPrintFormatInternal<char[5],char_const*>
                (logging_function,source_file,0x23a,ALL,Info,(ConstevalFormatString<2U>)0x848ef0,
                 (char (*) [5])"Next",&local_40);
      SVar5 = FAIL;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SVar5;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status SQLiteCursor::Next(DataStream& key, DataStream& value)
{
    int res = sqlite3_step(m_cursor_stmt);
    if (res == SQLITE_DONE) {
        return Status::DONE;
    }
    if (res != SQLITE_ROW) {
        LogPrintf("%s: Unable to execute cursor step: %s\n", __func__, sqlite3_errstr(res));
        return Status::FAIL;
    }

    key.clear();
    value.clear();

    // Leftmost column in result is index 0
    key.write(SpanFromBlob(m_cursor_stmt, 0));
    value.write(SpanFromBlob(m_cursor_stmt, 1));
    return Status::MORE;
}